

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void __thiscall AnonADIOSFile::~AnonADIOSFile(AnonADIOSFile *this)

{
  pointer pcVar1;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  adios2::core::Engine::Close((int)this->m_engine);
  pcVar1 = (this->m_IOname)._M_dataplus._M_p;
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_30,pcVar1,pcVar1 + (this->m_IOname)._M_string_length);
  adios2::core::ADIOS::RemoveIO(adios,local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  pcVar1 = (this->m_FileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_FileName).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_IOname)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_IOname).field_2) {
    operator_delete(pcVar1);
  }
  return;
}

Assistant:

~AnonADIOSFile()
    {
        m_engine->Close();
        adios.RemoveIO(m_IOname);
    }